

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_wav_init(ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                     void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                     ma_allocation_callbacks *pAllocationCallbacks,ma_wav *pWav)

{
  ma_bool32 mVar1;
  ma_decoding_backend_config *in_RCX;
  ma_dr_wav *in_RDX;
  ma_seek_proc in_RSI;
  ma_read_proc in_RDI;
  ma_wav *in_R8;
  void *in_R9;
  ma_bool32 wavResult;
  ma_result result;
  uint in_stack_ffffffffffffffc0;
  ma_result local_4;
  
  local_4 = ma_wav_init_internal(in_RCX,in_R8);
  if (local_4 == MA_SUCCESS) {
    if ((in_RDI == (ma_read_proc)0x0) || (in_RSI == (ma_seek_proc)0x0)) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      _wavResult->onRead = in_RDI;
      _wavResult->onSeek = in_RSI;
      _wavResult->onTell = (ma_tell_proc)in_RDX;
      _wavResult->pReadSeekTellUserData = in_RCX;
      mVar1 = ma_dr_wav_init(in_RDX,(ma_dr_wav_read_proc)in_RCX,(ma_dr_wav_seek_proc)in_R8,in_R9,
                             (ma_allocation_callbacks *)(ulong)in_stack_ffffffffffffffc0);
      if (mVar1 == 1) {
        ma_wav_post_init(_wavResult);
        local_4 = MA_SUCCESS;
      }
      else {
        local_4 = MA_INVALID_FILE;
      }
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_wav_init(ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_wav* pWav)
{
    ma_result result;

    result = ma_wav_init_internal(pConfig, pWav);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (onRead == NULL || onSeek == NULL) {
        return MA_INVALID_ARGS; /* onRead and onSeek are mandatory. */
    }

    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->onTell = onTell;
    pWav->pReadSeekTellUserData = pReadSeekTellUserData;

    #if !defined(MA_NO_WAV)
    {
        ma_bool32 wavResult;

        wavResult = ma_dr_wav_init(&pWav->dr, ma_wav_dr_callback__read, ma_wav_dr_callback__seek, pWav, pAllocationCallbacks);
        if (wavResult != MA_TRUE) {
            return MA_INVALID_FILE;
        }

        ma_wav_post_init(pWav);

        return MA_SUCCESS;
    }
    #else
    {
        /* wav is disabled. */
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}